

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeIteratorImpl.cpp
# Opt level: O1

DOMNode * __thiscall
xercesc_4_0::DOMNodeIteratorImpl::previousNode(DOMNodeIteratorImpl *this,DOMNode *node)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMException *this_00;
  DOMNode *pDVar2;
  
  if (this->fDetached == true) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fDocument == (DOMDocument *)0x0) {
      pDVar2 = (DOMNode *)&XMLPlatformUtils::fgMemoryManager;
    }
    else {
      pDVar2 = &this->fDocument[10].super_DOMNode;
    }
    DOMException::DOMException(this_00,0xb,0,(MemoryManager *)pDVar2->_vptr_DOMNode);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  if (this->fRoot == node) {
    pDVar2 = (DOMNode *)0x0;
  }
  else {
    iVar1 = (*node->_vptr_DOMNode[9])(node);
    pDVar2 = (DOMNode *)CONCAT44(extraout_var,iVar1);
    if (pDVar2 == (DOMNode *)0x0) {
      iVar1 = (*node->_vptr_DOMNode[5])(node);
      return (DOMNode *)CONCAT44(extraout_var_01,iVar1);
    }
    iVar1 = (*pDVar2->_vptr_DOMNode[0x12])(pDVar2);
    if ((char)iVar1 != '\0') {
      while ((this->fExpandEntityReferences != false ||
             (iVar1 = (*pDVar2->_vptr_DOMNode[4])(pDVar2), iVar1 != 5))) {
        iVar1 = (*pDVar2->_vptr_DOMNode[0x12])(pDVar2);
        if ((char)iVar1 == '\0') {
          return pDVar2;
        }
        iVar1 = (*pDVar2->_vptr_DOMNode[8])(pDVar2);
        pDVar2 = (DOMNode *)CONCAT44(extraout_var_00,iVar1);
      }
      return pDVar2;
    }
  }
  return pDVar2;
}

Assistant:

DOMNode* DOMNodeIteratorImpl::previousNode (DOMNode* node) {
	if (fDetached)
		throw DOMException(DOMException::INVALID_STATE_ERR, 0, GetDOMNodeIteratorMemoryManager);

    DOMNode* result = 0;

    // if we're at the root, return 0.
    if (node == fRoot)
			return 0;

    // get sibling
    result = node->getPreviousSibling();
    if (!result) {
        //if 1st sibling, return parent
        result = node->getParentNode();
        return result;
    }

    // if sibling has children, keep getting last child of child.
    if (result->hasChildNodes()) {
        while ((fExpandEntityReferences || result->getNodeType()!=DOMNode::ENTITY_REFERENCE_NODE) &&
               result->hasChildNodes()) {
            result = result->getLastChild();
        }
    }

    return result;
}